

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GreenRoomFourAction.cpp
# Opt level: O2

ActionResults * __thiscall GreenRoomFourAction::Use(GreenRoomFourAction *this)

{
  itemType iVar1;
  itemLocation iVar2;
  ItemWrapper *pIVar3;
  ActionResults *pAVar4;
  itemType local_54;
  string information;
  string local_30;
  
  iVar1 = Command::getActedOnItem((this->super_AbstractRoomAction).commands);
  if (iVar1 != KID) {
    pAVar4 = AbstractRoomAction::Use(&this->super_AbstractRoomAction);
    return pAVar4;
  }
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 != BUCKET) {
    information._M_dataplus._M_p._0_4_ = 0x13;
    pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,(itemType *)&information)
    ;
    iVar2 = ItemWrapper::getLocation(pIVar3);
    if (iVar2 != ACTIVE) {
      pAVar4 = AbstractRoomAction::Use(&this->super_AbstractRoomAction);
      return pAVar4;
    }
  }
  std::__cxx11::string::string
            ((string *)&information,
             "The otherworldy child drinks from the clean water basin.You can see strength return until a large burst of light illuminates the room.The room completely changes into vibrant gold colours. You have completed this leg of the journey.The creature now focuses on you, and with a flicker of his eye you hear the words in your ears....GO!\nThe creature vanishes and you see all doors lead back to the main entrance."
             ,(allocator *)&local_54);
  local_54 = KID;
  pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_54);
  ItemWrapper::setLocation(pIVar3,HIDDEN);
  local_54 = GREEN_KEY;
  pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_54);
  ItemWrapper::setLocation(pIVar3,HIDDEN);
  pAVar4 = (ActionResults *)operator_new(0x30);
  std::__cxx11::string::string((string *)&local_30,(string *)&information);
  ActionResults::ActionResults(pAVar4,CURRENT,&local_30,FIREWORKS);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&information);
  return pAVar4;
}

Assistant:

ActionResults *GreenRoomFourAction::Use() {

    if(commands->getActedOnItem() != KID)
        return AbstractRoomAction::Use();
    else {
        if (commands->getMainItem() != BUCKET && itemList->getValue(CLEAN_BUCKET)->getLocation() != ACTIVE) {
            return AbstractRoomAction::Use();
        } else {

            std::string information = "The otherworldy child drinks from the clean water basin."
                    "You can see strength return until a large burst of light illuminates the room."
                    "The room completely changes into vibrant gold colours. You have completed this leg of the journey."
                    "The creature now focuses on you, and with a flicker of his eye you hear the words in your ears....GO!\n"
                    "The creature vanishes and you see all doors lead back to the main entrance.";
            itemList->getValue(KID)->setLocation(HIDDEN);
            itemList->getValue(GREEN_KEY)->setLocation(HIDDEN);
            return new ActionResults(CURRENT, information, FIREWORKS);
        }
    }
}